

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMixedHybridMeshControl::CreateSkeletonAxialFluxes(TPZMHMixedHybridMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long lVar3;
  TPZCompEl *pTVar4;
  TPZCompEl **ppTVar5;
  TPZInterpolatedElement *pTVar6;
  TPZGeoEl *pTVar7;
  TPZGeoEl **ppTVar8;
  int64_t nelem;
  _Base_ptr p_Var9;
  _Self __tmp;
  long nelem_00;
  TPZManVector<TPZInterpolatedElement_*,_10> pressureelements;
  TPZGeoElSide local_c0;
  TPZInterpolatedElement *local_a8;
  TPZManVector<TPZInterpolatedElement_*,_10> local_a0;
  
  TPZGeoMesh::ResetReference
            (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer);
  lVar3 = (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fPressureFineMesh.fRef)->
           fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  local_a8 = (TPZInterpolatedElement *)0x0;
  TPZManVector<TPZInterpolatedElement_*,_10>::TPZManVector
            (&local_a0,
             (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer->
             fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements,&local_a8);
  if (0 < lVar3) {
    nelem_00 = 0;
    do {
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.
                              fPressureFineMesh.fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,nelem_00);
      pTVar4 = *ppTVar5;
      if (pTVar4 != (TPZCompEl *)0x0) {
        pTVar6 = (TPZInterpolatedElement *)
                 __dynamic_cast(pTVar4,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
        if (pTVar6 == (TPZInterpolatedElement *)0x0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedHybridMeshControl.cpp"
                     ,0x452);
        }
        pTVar7 = TPZCompEl::Reference(pTVar4);
        local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore[pTVar7->fIndex] = pTVar6;
      }
      nelem_00 = nelem_00 + 1;
    } while (lVar3 != nelem_00);
  }
  p_Var9 = *(_Base_ptr *)
            ((long)&(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fInterfaces._M_t.
                    _M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var1 = &(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fInterfaces._M_t._M_impl.
            super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      if ((*(_Base_ptr *)(p_Var9 + 1) != p_Var9[1]._M_left) &&
         (pTVar4 = (TPZCompEl *)
                   local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore
                   [(long)*(_Base_ptr *)(p_Var9 + 1)], pTVar4 != (TPZCompEl *)0x0)) {
        pTVar7 = TPZCompEl::Reference(pTVar4);
        iVar2 = pTVar7->fMatId;
        ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (&(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.
                               fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                             *(int64_t *)(p_Var9 + 1));
        pTVar7 = *ppTVar8;
        local_c0.fSide = (**(code **)(*(long *)pTVar7 + 0xf0))(pTVar7);
        local_c0.fSide = local_c0.fSide + -1;
        local_c0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
        local_c0.fGeoEl = pTVar7;
        nelem = HasNeighbour(&local_c0,&this->fSkeletonWithFlowMatId);
        if ((nelem == -1) && (iVar2 == this->fSkeletonWithFlowPressureMatId)) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedHybridMeshControl.cpp"
                     ,0x46c);
        }
        if (nelem != -1) {
          ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                              (&(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.
                                 fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                               nelem);
          iVar2 = (*ppTVar8)->fMatId;
          (*ppTVar8)->fMatId =
               (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fSkeletonMatId;
          CreateAxialFluxElement(this,(TPZInterpolatedElement *)pTVar4,iVar2);
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  if (local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore == local_a0.fExtAlloc) {
    local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore = (TPZInterpolatedElement **)0x0;
  }
  local_a0.super_TPZVec<TPZInterpolatedElement_*>.fNAlloc = 0;
  local_a0.super_TPZVec<TPZInterpolatedElement_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a08830
  ;
  if (local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore != (TPZInterpolatedElement **)0x0) {
    operator_delete__(local_a0.super_TPZVec<TPZInterpolatedElement_*>.fStore);
  }
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::CreateSkeletonAxialFluxes()
{
    fGMesh->ResetReference();
    // create a vector that points a geometric element index to a pressure computational element
    int64_t nel = fPressureFineMesh->NElements();
    TPZManVector<TPZInterpolatedElement *> pressureelements(fGMesh->NElements(),0);
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        if (!cel) {
            continue;
        }
        TPZInterpolatedElement *press = dynamic_cast<TPZInterpolatedElement *>(cel);
        if(!press) DebugStop();
#ifdef PZDEBUG
        if (!cel->Reference()) {
            DebugStop();
        }
#endif
        TPZGeoEl *gel = cel->Reference();
        pressureelements[gel->Index()] = press;
    }
    /// indices of the skeleton elements and their left/right geometric elements of the skeleton mesh
//    std::map<int64_t, std::pair<int64_t,int64_t> > fInterfaces;
    for (auto it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        TPZInterpolatedElement *press = pressureelements[it->first];
        if (!press) {
            continue;
        }
        int pressmatid = press->Reference()->MaterialId();
        TPZGeoEl *gel = fGMesh->Element(it->first);
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        int64_t elindex = -1;
        elindex = HasNeighbour(gelside, fSkeletonWithFlowMatId);
        if (pressmatid == fSkeletonWithFlowPressureMatId && elindex == -1) {
            DebugStop();
        }
        if (elindex == -1) {
            continue;
        }
        TPZGeoEl *gelflux = fGMesh->Element(elindex);
        int gelfluxmatid = gelflux->MaterialId();
#ifdef PZDEBUG
        {
            // if two fracture flow elements would be created, an error in the datastructure occurred
            TPZGeoEl *gel = fGMesh->Element(it->first);
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            if (HasNeighbour(gelside, fFractureFlowDim1MatId) != -1) {
                DebugStop();
            }
        }
#endif
        gelflux->SetMaterialId(fSkeletonMatId);
        CreateAxialFluxElement(press, gelfluxmatid);
    }
}